

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall itis::AVLTree<long_long>::erase(AVLTree<long_long> *this,longlong value)

{
  AVLTreeNode<long_long> *pAVar1;
  long lVar2;
  AVLTreeNode<long_long> *pAVar3;
  AVLTreeNode<long_long> **indirect;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> path;
  AVLTreeNode<long_long> *local_48;
  _Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  local_40;
  
  indirect = &this->root;
  path.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  path.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    if (*indirect == (AVLTreeNode<long_long> *)0x0) goto LAB_00104a2b;
    if ((*indirect)->value == value) break;
    std::vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>::
    push_back(&path,&indirect);
    indirect = &(*indirect)->right + (value < (*indirect)->value);
  }
  std::vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>::
  push_back(&path,&indirect);
  lVar2 = (long)path.
                super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)path.
                super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = *indirect;
  pAVar3 = pAVar1->right;
  if (pAVar1->left == (AVLTreeNode<long_long> *)0x0) {
    if (pAVar3 != (AVLTreeNode<long_long> *)0x0) goto LAB_00104942;
    operator_delete(pAVar1,0x20);
    *indirect = (AVLTreeNode<long_long> *)0x0;
  }
  else {
    if (pAVar3 != (AVLTreeNode<long_long> *)0x0) {
LAB_00104942:
      while (local_48 = pAVar1, pAVar3->left != (AVLTreeNode<long_long> *)0x0) {
        std::
        vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>::
        push_back(&path,(value_type *)&local_48);
        pAVar1 = (AVLTreeNode<long_long> *)&local_48->right->left;
        pAVar3 = local_48->right->left;
      }
      if (pAVar3 == (*indirect)->right) {
        pAVar3->left = (*indirect)->left;
        pAVar3 = *indirect;
        *indirect = pAVar1->right;
        operator_delete(pAVar3,0x20);
      }
      else {
        (*path.
          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1])->left = pAVar3->right;
        pAVar3->left = (*indirect)->left;
        pAVar3->right = (*indirect)->right;
        operator_delete(*indirect,0x20);
        *indirect = pAVar3;
        *(AVLTreeNode<long_long> **)
         ((long)path.
                super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar2) = pAVar3;
      }
LAB_00104a03:
      std::vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ::vector((vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                *)&local_40,&path);
      balance(this,(vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                    *)&local_40);
      std::
      _Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ::~_Vector_base(&local_40);
      this->_size = this->_size + -1;
LAB_00104a2b:
      std::
      _Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ::~_Vector_base(&path.
                       super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                     );
      return;
    }
    *indirect = pAVar1->left;
    operator_delete(pAVar1,0x20);
  }
  path.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       path.
       super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  goto LAB_00104a03;
}

Assistant:

void AVLTree<T>::erase(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr and (*indirect)->value != value) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    if (*indirect == nullptr) {  // the value does not exist in tree
      return;                    // may be raising an Exception is more elegant
    }

    path.push_back(indirect);

    std::size_t index = path.size();

    if ((*indirect)->left == nullptr and (*indirect)->right == nullptr) {  // the node is leaf
      delete *indirect;                                                    // just delete node
      *indirect = nullptr;
      path.pop_back();  // pop the deleted node from path
    }

    else if ((*indirect)->right == nullptr) {  // only left child exists
      AVLTreeNode<T> *toRemove = *indirect;

      (*indirect) = (*indirect)->left;
      delete toRemove;

      path.pop_back();
    }

    else {  // right child exists
      AVLTreeNode<T> **successor = &((*indirect)->right);

      while ((*successor)->left != nullptr) {
        path.push_back(successor);
        successor = &((*successor)->left);
      }

      if (*successor == (*indirect)->right) {
        (*successor)->left = (*indirect)->left;

        AVLTreeNode<T> *toRemove = *indirect;
        *indirect = *successor;
        delete toRemove;
      }

      else {
        AVLTreeNode<T> *tmp = *path.back();
        AVLTreeNode<T> *suc = *successor;

        tmp->left = (*successor)->right;
        suc->left = (*indirect)->left;
        suc->right = (*indirect)->right;

        delete *indirect;
        *indirect = suc;
        path[index] = &(suc->right);
      }
    }

    balance(path);
    _size--;
  }